

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjLoad(jx9_value *pSrc,jx9_value *pDest)

{
  jx9_value *pDest_local;
  jx9_value *pSrc_local;
  
  SyMemcpy(pSrc,pDest,0x14);
  if ((pSrc->iFlags & 0x40U) != 0) {
    *(int *)((pSrc->x).iVal + 0x50) = *(int *)((pSrc->x).iVal + 0x50) + 1;
  }
  if ((pDest->sBlob).nByte != 0) {
    SyBlobRelease(&pDest->sBlob);
  }
  if ((pSrc->sBlob).nByte != 0) {
    SyBlobReadOnly(&pDest->sBlob,(pSrc->sBlob).pBlob,(pSrc->sBlob).nByte);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjLoad(jx9_value *pSrc, jx9_value *pDest)
{
	SyMemcpy((const void *)&(*pSrc), &(*pDest), 
		sizeof(jx9_value)-(sizeof(jx9_vm *)+sizeof(SyBlob)+sizeof(sxu32)));
	if( pSrc->iFlags & MEMOBJ_HASHMAP ){
		/* Increment reference count */
		((jx9_hashmap *)pSrc->x.pOther)->iRef++;
	}
	if( SyBlobLength(&pDest->sBlob) > 0 ){
		SyBlobRelease(&pDest->sBlob);
	}
	if( SyBlobLength(&pSrc->sBlob) > 0 ){
		SyBlobReadOnly(&pDest->sBlob, SyBlobData(&pSrc->sBlob), SyBlobLength(&pSrc->sBlob));
	}
	return SXRET_OK;
}